

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line_interface_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::anon_unknown_0::
CommandLineInterfaceTest_Proto3OptionalDisallowedNoCodegenSupport_Test::
~CommandLineInterfaceTest_Proto3OptionalDisallowedNoCodegenSupport_Test
          (CommandLineInterfaceTest_Proto3OptionalDisallowedNoCodegenSupport_Test *this)

{
  CommandLineInterfaceTest_Proto3OptionalDisallowedNoCodegenSupport_Test *this_local;
  
  ~CommandLineInterfaceTest_Proto3OptionalDisallowedNoCodegenSupport_Test(this);
  operator_delete(this,0x2e8);
  return;
}

Assistant:

TEST_F(CommandLineInterfaceTest, Proto3OptionalDisallowedNoCodegenSupport) {
  CreateTempFile("google/foo.proto",
                 "syntax = \"proto3\";\n"
                 "message Foo {\n"
                 "  optional int32 i = 1;\n"
                 "}\n");

  CreateGeneratorWithMissingFeatures("--no_proto3_optional_out",
                                     "Doesn't support proto3 optional",
                                     CodeGenerator::FEATURE_PROTO3_OPTIONAL);

  Run("protocol_compiler --experimental_allow_proto3_optional "
      "--proto_path=$tmpdir google/foo.proto --no_proto3_optional_out=$tmpdir");

  ExpectErrorSubstring(
      "code generator --no_proto3_optional_out hasn't been updated to support "
      "optional fields in proto3");
}